

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SanityCheckPass.h
# Opt level: O3

void __thiscall
soul::SanityCheckPass::PostResolutionChecks::visit
          (PostResolutionChecks *this,EndpointDeclaration *e)

{
  string *name;
  EndpointDetails *pEVar1;
  bool bVar2;
  Identifier *in_R9;
  pool_ptr<soul::AST::Expression> local_50;
  CompileMessage local_48;
  
  ASTVisitor::visit(&this->super_ASTVisitor,e);
  name = (e->name).name;
  if (name == (string *)0x0) {
    throwInternalCompilerError("isValid()","operator const std::basic_string<char> &",0x21);
  }
  bVar2 = heart::isReservedFunctionName(name);
  if (!bVar2) {
    pEVar1 = (e->details).object;
    if (pEVar1 != (EndpointDetails *)0x0) {
      bVar2 = AST::EndpointDetails::isResolved(pEVar1);
      if (bVar2) {
        checkEndpointDataTypes(e);
        pEVar1 = (e->details).object;
        if (pEVar1 == (EndpointDetails *)0x0) {
          throwInternalCompilerError("object != nullptr","operator*",0x3b);
        }
        local_50.object = (pEVar1->arraySize).object;
        checkArraySize(this,&local_50,0x100);
      }
    }
    return;
  }
  CompileMessageHelpers::createMessage<soul::Identifier&>
            (&local_48,(CompileMessageHelpers *)0x1,none,0x27dab7,(char *)&e->name,in_R9);
  AST::Context::throwError(&(e->super_ASTObject).context,&local_48,false);
}

Assistant:

void visit (AST::EndpointDeclaration& e) override
        {
            super::visit (e);

            if (heart::isReservedFunctionName (e.name))
                e.context.throwError (Errors::invalidEndpointName (e.name));

            if (e.isResolved())
            {
                checkEndpointDataTypes (e);
                checkArraySize (e.getDetails().arraySize, AST::maxEndpointArraySize);
            }
        }